

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall QDockAreaLayoutInfo::setCurrentTabId(QDockAreaLayoutInfo *this,quintptr id)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QMetaType QVar4;
  anon_union_24_3_e3d07ef4_for_data *paVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  QMetaType local_68;
  QMetaType local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  undefined7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->tabbed == true) && (this->tabBar != (QTabBar *)0x0)) &&
     (iVar2 = QTabBar::count(this->tabBar), 0 < iVar2)) {
    iVar2 = 0;
    do {
      QTabBar::tabData((QVariant *)&local_58,this->tabBar,iVar2);
      local_60.d_ptr =
           (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType
      ;
      local_68.d_ptr = (QMetaTypeInterface *)(CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc);
      bVar1 = comparesEqual(&local_68,&local_60);
      if (bVar1) {
        uVar6 = local_58.shared;
        if ((local_40 & 1) != 0) {
          uVar6 = *(QMetaTypeInterface **)(local_58.shared + (int)*(uint *)(local_58.shared + 4));
        }
      }
      else {
        local_68.d_ptr = (QMetaTypeInterface *)0x0;
        QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        paVar5 = &local_58;
        if ((local_40 & 1) != 0) {
          paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_58.shared + (int)*(uint *)(local_58.shared + 4));
        }
        QMetaType::convert(QVar4,paVar5,local_60,&local_68);
        uVar6 = local_68.d_ptr;
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
      if (uVar6 == id) {
        QTabBar::setCurrentIndex(this->tabBar,iVar2);
        break;
      }
      iVar2 = iVar2 + 1;
      iVar3 = QTabBar::count(this->tabBar);
    } while (iVar2 < iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::setCurrentTabId(quintptr id)
{
    if (!tabbed || tabBar == nullptr)
        return;

    for (int i = 0; i < tabBar->count(); ++i) {
        if (qvariant_cast<quintptr>(tabBar->tabData(i)) == id) {
            tabBar->setCurrentIndex(i);
            return;
        }
    }
}